

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

void tcu::astc::generateDummyNormalBlocks
               (deUint8 *dst,size_t numBlocks,int blockWidth,int blockHeight)

{
  bool bVar1;
  ulong uVar2;
  NormalBlockISEInputs *iseInputs_00;
  ulong extraout_RDX;
  ulong uVar3;
  NormalBlockISEInputs *pNVar4;
  bool bVar5;
  long lVar6;
  deUint8 *pdVar7;
  ulong uVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  AssignBlock128 AVar12;
  NormalBlockISEInputs iseInputs;
  NormalBlockParams local_c6c;
  NormalBlockISEInputs local_c38;
  long lVar11;
  
  local_c6c.ccs = 0xffffffff;
  local_c6c.numPartitions = 1;
  local_c6c.isMultiPartSingleCemMode = false;
  local_c6c.partitionSeed = 0xffffffff;
  local_c6c.colorEndpointModes[1] = 0;
  local_c6c.colorEndpointModes[2] = 0;
  local_c6c.colorEndpointModes[3] = 0;
  local_c6c.weightGridWidth = 3;
  local_c6c.weightGridHeight = 3;
  local_c6c.weightISEParams.mode = ISEMODE_PLAIN_BIT;
  local_c6c.weightISEParams.numBits = 5;
  local_c6c.isDualPlane = false;
  local_c6c.colorEndpointModes[0] = 8;
  anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_c6c);
  local_c38.weight.isGivenInBlockForm = false;
  if (numBlocks != 0) {
    uVar8 = numBlocks * 9 - 1;
    pNVar4 = (NormalBlockISEInputs *)0x1f;
    sVar9 = 0;
    uVar3 = extraout_RDX;
    do {
      lVar6 = 2;
      iseInputs_00 = pNVar4;
      auVar10 = _DAT_00942880;
      do {
        if (SUB164(auVar10 ^ _DAT_00942940,4) == -0x80000000 &&
            SUB164(auVar10 ^ _DAT_00942940,0) < -0x7ffffff7) {
          local_c6c.colorEndpointModes[lVar6 + 5] =
               (deUint32)((ulong)((long)&iseInputs_00[-1].endpoint.value + 0x5e1U) / uVar8);
          uVar3 = (ulong)iseInputs_00 % uVar8;
          *(int *)(&local_c38.weight.isGivenInBlockForm + lVar6 * 4) =
               (int)((ulong)iseInputs_00 / uVar8);
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        iseInputs_00 = (NormalBlockISEInputs *)((long)(iseInputs_00->weight).value.plain + 0x3a);
        lVar6 = lVar6 + 2;
      } while (lVar6 != 0xc);
      AVar12 = anon_unknown_0::generateNormalBlock
                         (&local_c6c,(int)&local_c38,(int)uVar3,iseInputs_00);
      uVar3 = AVar12.m_words[1];
      lVar6 = 0;
      uVar2 = AVar12.m_words[0];
      bVar1 = true;
      do {
        bVar5 = bVar1;
        pdVar7 = dst + lVar6;
        lVar6 = 0;
        do {
          *pdVar7 = (deUint8)(uVar2 >> ((byte)lVar6 & 0x3f));
          lVar6 = lVar6 + 8;
          pdVar7 = pdVar7 + 1;
        } while (lVar6 != 0x40);
        lVar6 = 8;
        uVar2 = uVar3;
        bVar1 = false;
      } while (bVar5);
      sVar9 = sVar9 + 1;
      pNVar4 = (NormalBlockISEInputs *)((long)&(pNVar4->weight).value + 0x113);
      dst = dst + 0x10;
    } while (sVar9 != numBlocks);
  }
  return;
}

Assistant:

void generateDummyNormalBlocks (deUint8* dst, size_t numBlocks, int blockWidth, int blockHeight)
{
	NormalBlockParams blockParams;

	blockParams.weightGridWidth			= 3;
	blockParams.weightGridHeight		= 3;
	blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 5);
	blockParams.isDualPlane				= false;
	blockParams.numPartitions			= 1;
	blockParams.colorEndpointModes[0]	= 8;

	NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
	iseInputs.weight.isGivenInBlockForm = false;

	const int numWeights		= computeNumWeights(blockParams);
	const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

	for (size_t blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
			iseInputs.weight.value.plain[weightNdx] = (deUint32)((blockNdx*numWeights + weightNdx) * weightRangeMax / (numBlocks*numWeights-1));

		generateNormalBlock(blockParams, blockWidth, blockHeight, iseInputs).assignToMemory(dst + blockNdx*BLOCK_SIZE_BYTES);
	}
}